

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopFissionImpl::CanPerformSplit(LoopFissionImpl *this)

{
  pointer *this_00;
  IRContext *context;
  ulong uVar1;
  bool bVar2;
  Op OVar3;
  size_t size;
  reference ppIVar4;
  reference ppIVar5;
  mapped_type_conflict *pmVar6;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *pvVar7;
  reference pDVar8;
  DistanceEntry *entry_1;
  iterator __end7;
  iterator __begin7;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *__range7;
  DistanceVector vec_1;
  Instruction *load;
  iterator __end5;
  iterator __begin5;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range5;
  DistanceEntry *entry;
  iterator __end6;
  iterator __begin6;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *__range6;
  DistanceVector vec;
  Instruction *store;
  iterator __end4;
  iterator __begin4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range4;
  Instruction *inst_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *__range2_1;
  size_t loop_depth;
  Instruction *local_188;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> set_one_loads;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> set_one_stores
  ;
  undefined1 local_120 [8];
  LoopDependenceAnalysis analysis;
  Loop *parent_loop;
  vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> loops;
  LoopFissionImpl *this_local;
  
  if ((this->load_used_in_condition_ & 1U) == 0) {
    loops.
    super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
    std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::vector
              ((vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *)
               &parent_loop);
    for (analysis.constraints_.
         super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
         ._M_impl._M_node._M_size = (size_t)this->loop_;
        analysis.constraints_.
        super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
        ._M_impl._M_node._M_size != 0;
        analysis.constraints_.
        super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
        ._M_impl._M_node._M_size =
             (size_t)Loop::GetParent((Loop *)analysis.constraints_.
                                             super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
                                             ._M_impl._M_node._M_size)) {
      std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::
      push_back((vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *
                )&parent_loop,
                (value_type *)
                &analysis.constraints_.
                 super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
                 ._M_impl._M_node._M_size);
    }
    context = this->context_;
    std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::vector
              ((vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *)
               &set_one_stores.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *)
               &parent_loop);
    LoopDependenceAnalysis::LoopDependenceAnalysis
              ((LoopDependenceAnalysis *)local_120,context,
               (vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *)
               &set_one_stores.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::~vector
              ((vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *)
               &set_one_stores.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    memset(&set_one_loads.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x18);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&set_one_loads.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    memset(&__range2,0,0x18);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&__range2);
    __end2 = std::
             set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             ::begin(&this->cloned_loop_instructions_);
    inst = (Instruction *)
           std::
           set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end(&this->cloned_loop_instructions_);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&inst), bVar2) {
      ppIVar4 = std::_Rb_tree_const_iterator<spvtools::opt::Instruction_*>::operator*(&__end2);
      local_188 = *ppIVar4;
      OVar3 = Instruction::opcode(local_188);
      if (OVar3 == OpStore) {
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&set_one_loads.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_188);
      }
      else {
        OVar3 = Instruction::opcode(local_188);
        if (OVar3 == OpLoad) {
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)&__range2,&local_188);
        }
      }
      bVar2 = MovableInstruction(this,local_188);
      if (!bVar2) {
        this_local._7_1_ = 0;
        goto LAB_003f62a3;
      }
      std::_Rb_tree_const_iterator<spvtools::opt::Instruction_*>::operator++(&__end2);
    }
    size = Loop::GetDepth(this->loop_);
    __end2_1 = std::
               set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
               ::begin(&this->original_loop_instructions_);
    inst_1 = (Instruction *)
             std::
             set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             ::end(&this->original_loop_instructions_);
    while (bVar2 = std::operator!=(&__end2_1,(_Self *)&inst_1), bVar2) {
      ppIVar4 = std::_Rb_tree_const_iterator<spvtools::opt::Instruction_*>::operator*(&__end2_1);
      __range4 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)*ppIVar4;
      bVar2 = MovableInstruction(this,(Instruction *)__range4);
      if (!bVar2) {
        this_local._7_1_ = 0;
        goto LAB_003f62a3;
      }
      OVar3 = Instruction::opcode((Instruction *)__range4);
      if (OVar3 == OpLoad) {
        this_00 = &set_one_loads.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end4 = std::
                 vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          *)this_00);
        store = (Instruction *)
                std::
                vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       *)this_00);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                           *)&store), bVar2) {
          ppIVar5 = __gnu_cxx::
                    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                    ::operator*(&__end4);
          vec.entries.
          super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppIVar5;
          DistanceVector::DistanceVector((DistanceVector *)&__range6,size);
          pmVar6 = std::
                   map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                   ::operator[](&this->instruction_order_,
                                (key_type *)
                                &vec.entries.
                                 super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          uVar1 = *pmVar6;
          pmVar6 = std::
                   map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                   ::operator[](&this->instruction_order_,(key_type *)&__range4);
          if (*pmVar6 < uVar1) {
            this_local._7_1_ = 0;
            bVar2 = true;
          }
          else {
            bVar2 = LoopDependenceAnalysis::GetDependence
                              ((LoopDependenceAnalysis *)local_120,
                               (Instruction *)
                               vec.entries.
                               super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (Instruction *)__range4,(DistanceVector *)&__range6);
            if (!bVar2) {
              pvVar7 = DistanceVector::GetEntries((DistanceVector *)&__range6);
              __end6 = std::
                       vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                       ::begin(pvVar7);
              entry = (DistanceEntry *)
                      std::
                      vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                      ::end(pvVar7);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end6,(__normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                                                 *)&entry), bVar2) {
                pDVar8 = __gnu_cxx::
                         __normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                         ::operator*(&__end6);
                if (0 < pDVar8->distance) {
                  this_local._7_1_ = 0;
                  bVar2 = true;
                  goto LAB_003f6069;
                }
                __gnu_cxx::
                __normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                ::operator++(&__end6);
              }
            }
            bVar2 = false;
          }
LAB_003f6069:
          DistanceVector::~DistanceVector((DistanceVector *)&__range6);
          if (bVar2) goto LAB_003f62a3;
          __gnu_cxx::
          __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
          ::operator++(&__end4);
        }
      }
      else {
        OVar3 = Instruction::opcode((Instruction *)__range4);
        if (OVar3 == OpStore) {
          __end5 = std::
                   vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            *)&__range2);
          load = (Instruction *)
                 std::
                 vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)&__range2);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                             *)&load), bVar2) {
            ppIVar5 = __gnu_cxx::
                      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                      ::operator*(&__end5);
            vec_1.entries.
            super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppIVar5;
            DistanceVector::DistanceVector((DistanceVector *)&__range7,size);
            pmVar6 = std::
                     map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                     ::operator[](&this->instruction_order_,
                                  (key_type *)
                                  &vec_1.entries.
                                   super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            uVar1 = *pmVar6;
            pmVar6 = std::
                     map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                     ::operator[](&this->instruction_order_,(key_type *)&__range4);
            if (*pmVar6 < uVar1) {
              this_local._7_1_ = 0;
              bVar2 = true;
            }
            else {
              bVar2 = LoopDependenceAnalysis::GetDependence
                                ((LoopDependenceAnalysis *)local_120,(Instruction *)__range4,
                                 (Instruction *)
                                 vec_1.entries.
                                 super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (DistanceVector *)&__range7);
              if (!bVar2) {
                pvVar7 = DistanceVector::GetEntries((DistanceVector *)&__range7);
                __end7 = std::
                         vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                         ::begin(pvVar7);
                entry_1 = (DistanceEntry *)
                          std::
                          vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                          ::end(pvVar7);
                while (bVar2 = __gnu_cxx::operator!=
                                         (&__end7,(
                                                  __normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                                                  *)&entry_1), bVar2) {
                  pDVar8 = __gnu_cxx::
                           __normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                           ::operator*(&__end7);
                  if (pDVar8->distance < 0) {
                    this_local._7_1_ = 0;
                    bVar2 = true;
                    goto LAB_003f6253;
                  }
                  __gnu_cxx::
                  __normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                  ::operator++(&__end7);
                }
              }
              bVar2 = false;
            }
LAB_003f6253:
            DistanceVector::~DistanceVector((DistanceVector *)&__range7);
            if (bVar2) goto LAB_003f62a3;
            __gnu_cxx::
            __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
            ::operator++(&__end5);
          }
        }
      }
      std::_Rb_tree_const_iterator<spvtools::opt::Instruction_*>::operator++(&__end2_1);
    }
    this_local._7_1_ = 1;
LAB_003f62a3:
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &__range2);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &set_one_loads.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    LoopDependenceAnalysis::~LoopDependenceAnalysis((LoopDependenceAnalysis *)local_120);
    std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::~vector
              ((vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *)
               &parent_loop);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool LoopFissionImpl::CanPerformSplit() {
  // Return false if any of the condition instructions in the loop depend on a
  // load.
  if (load_used_in_condition_) {
    return false;
  }

  // Build a list of all parent loops of this loop. Loop dependence analysis
  // needs this structure.
  std::vector<const Loop*> loops;
  Loop* parent_loop = loop_;
  while (parent_loop) {
    loops.push_back(parent_loop);
    parent_loop = parent_loop->GetParent();
  }

  LoopDependenceAnalysis analysis{context_, loops};

  // A list of all the stores in the cloned loop.
  std::vector<Instruction*> set_one_stores{};

  // A list of all the loads in the cloned loop.
  std::vector<Instruction*> set_one_loads{};

  // Populate the above lists.
  for (Instruction* inst : cloned_loop_instructions_) {
    if (inst->opcode() == spv::Op::OpStore) {
      set_one_stores.push_back(inst);
    } else if (inst->opcode() == spv::Op::OpLoad) {
      set_one_loads.push_back(inst);
    }

    // If we find any instruction which we can't move (such as a barrier),
    // return false.
    if (!MovableInstruction(*inst)) return false;
  }

  // We need to calculate the depth of the loop to create the loop dependency
  // distance vectors.
  const size_t loop_depth = loop_->GetDepth();

  // Check the dependencies between loads in the cloned loop and stores in the
  // original and vice versa.
  for (Instruction* inst : original_loop_instructions_) {
    // If we find any instruction which we can't move (such as a barrier),
    // return false.
    if (!MovableInstruction(*inst)) return false;

    // Look at the dependency between the loads in the original and stores in
    // the cloned loops.
    if (inst->opcode() == spv::Op::OpLoad) {
      for (Instruction* store : set_one_stores) {
        DistanceVector vec{loop_depth};

        // If the store actually should appear after the load, return false.
        // This means the store has been placed in the wrong grouping.
        if (instruction_order_[store] > instruction_order_[inst]) {
          return false;
        }
        // If not independent check the distance vector.
        if (!analysis.GetDependence(store, inst, &vec)) {
          for (DistanceEntry& entry : vec.GetEntries()) {
            // A distance greater than zero means that the store in the cloned
            // loop has a dependency on the load in the original loop.
            if (entry.distance > 0) return false;
          }
        }
      }
    } else if (inst->opcode() == spv::Op::OpStore) {
      for (Instruction* load : set_one_loads) {
        DistanceVector vec{loop_depth};

        // If the load actually should appear after the store, return false.
        if (instruction_order_[load] > instruction_order_[inst]) {
          return false;
        }

        // If not independent check the distance vector.
        if (!analysis.GetDependence(inst, load, &vec)) {
          for (DistanceEntry& entry : vec.GetEntries()) {
            // A distance less than zero means the load in the cloned loop is
            // dependent on the store instruction in the original loop.
            if (entry.distance < 0) return false;
          }
        }
      }
    }
  }
  return true;
}